

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_indexOf(Context *context,IntrinsicResult partialResult)

{
  code *pcVar1;
  _func_int *p_Var2;
  _func_int *__s2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  int32_t iVar4;
  int iVar5;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar6;
  undefined4 *puVar7;
  long *plVar8;
  _func_int **pp_Var9;
  size_t posB;
  ulong uVar10;
  int i;
  ulong uVar11;
  _func_int **pp_Var12;
  Value *lhs;
  anon_union_8_3_2f476f46_for_data aVar13;
  _func_int **pp_Var14;
  long lVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar19;
  String str;
  Value after;
  Value self;
  ValueDict dict;
  String s;
  Value value;
  anon_union_8_3_2f476f46_for_data local_108;
  _func_int *local_100;
  Context *local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  ValueDict local_d0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_b8;
  _func_int **local_b0;
  anon_union_8_3_2f476f46_for_data local_a8;
  long *local_a0;
  char local_98;
  long *local_90;
  anon_union_8_3_2f476f46_for_data local_88;
  undefined1 local_80 [16];
  Value local_70;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_60;
  anon_union_8_3_2f476f46_for_data local_58;
  Value local_50;
  Value local_40;
  
  local_58.tempNum._0_1_ = false;
  pDVar6 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar6->super_RefCountedStorage).refCount = 1;
  (pDVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  pDVar6->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar6->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar7 = (undefined4 *)operator_new__(5);
  pDVar6->mSize = (long)puVar7;
  *(undefined1 *)(puVar7 + 1) = 0;
  *puVar7 = 0x666c6573;
  local_60 = pDVar6;
  Context::GetVar((Context *)local_e0,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  if ((local_60 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_58.tempNum._0_1_ == false)) {
    plVar8 = &(local_60->super_RefCountedStorage).refCount;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*(local_60->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_60 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  local_88.tempNum._0_1_ = '\0';
  plVar8 = (long *)operator_new(0x30);
  plVar8[1] = 1;
  *plVar8 = (long)&PTR__StringStorage_001bf0d8;
  plVar8[3] = 6;
  plVar8[4] = -1;
  puVar7 = (undefined4 *)operator_new__(6);
  plVar8[2] = (long)puVar7;
  *(undefined2 *)(puVar7 + 1) = 0x65;
  *puVar7 = 0x756c6176;
  local_90 = plVar8;
  Context::GetVar((Context *)local_80,(String *)partialResult.rs,(LocalOnlyMode)&local_90);
  if ((local_90 != (long *)0x0) && (local_88.tempNum._0_1_ == '\0')) {
    plVar8 = local_90 + 1;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (**(code **)(*local_90 + 8))();
    }
    local_90 = (long *)0x0;
  }
  local_98 = '\0';
  plVar8 = (long *)operator_new(0x30);
  plVar8[1] = 1;
  *plVar8 = (long)&PTR__StringStorage_001bf0d8;
  plVar8[3] = 6;
  plVar8[4] = -1;
  puVar7 = (undefined4 *)operator_new__(6);
  plVar8[2] = (long)puVar7;
  *(undefined2 *)(puVar7 + 1) = 0x72;
  *puVar7 = 0x65746661;
  local_a0 = plVar8;
  Context::GetVar((Context *)local_f0,(String *)partialResult.rs,(LocalOnlyMode)&local_a0);
  if ((local_a0 != (long *)0x0) && (local_98 == '\0')) {
    plVar8 = local_a0 + 1;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (**(code **)(*local_a0 + 8))();
    }
    local_a0 = (long *)0x0;
  }
  aVar13 = (anon_union_8_3_2f476f46_for_data)local_e0._8_8_;
  if (local_e0[0] == String) {
    if ((StringStorage *)local_e0._8_8_ != (StringStorage *)0x0) {
      *(long *)(local_e0._8_8_ + 8) = *(long *)(local_e0._8_8_ + 8) + 1;
    }
    local_108.ref = (RefCountedStorage *)local_e0._8_8_;
    local_100 = (_func_int *)((ulong)local_100 & 0xffffffffffffff00);
    Value::ToString((Value *)&local_b0,(Machine *)local_80);
    if (local_f0[0] == Null) {
      lVar15 = -1;
    }
    else {
      iVar4 = Value::IntValue((Value *)local_f0);
      lVar15 = (long)iVar4;
      if (iVar4 < -1) {
        if ((StringStorage *)local_108.ref == (StringStorage *)0x0) {
          pp_Var9 = (_func_int **)0x0;
        }
        else {
          pp_Var9 = local_108.ref[2]._vptr_RefCountedStorage;
          if ((long)pp_Var9 < 0) {
            StringStorage::analyzeChars((StringStorage *)local_108.ref);
            pp_Var9 = local_108.ref[2]._vptr_RefCountedStorage;
          }
        }
        lVar15 = (long)pp_Var9 + lVar15;
      }
    }
    posB = String::bytePosOfCharPos((String *)&local_108,lVar15 + 1);
    pp_Var9 = local_b0;
    if ((StringStorage *)local_108.ref == (StringStorage *)0x0) {
LAB_00146a9d:
      if (pp_Var9 != (_func_int **)0x0) goto LAB_00146aa2;
    }
    else {
      if (local_b0 == (_func_int **)0x0) {
LAB_001469c9:
        if (0 < (long)posB) {
          posB = String::charPosOfBytePos((String *)&local_108,posB);
        }
        pp_Var9 = local_b0;
        if (-1 < (long)posB) {
          local_40.data.number = (double)(long)posB;
          local_40.type = Number;
          local_40.noInvoke = false;
          local_40.localOnly = Off;
          ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
          IntrinsicResult::ensureStorage((IntrinsicResult *)context);
          Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage
                                    + 3),&local_40);
          *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
          if ((2 < local_40.type) &&
             ((ListStorage<MiniScript::Value> *)local_40.data.ref !=
              (ListStorage<MiniScript::Value> *)0x0)) {
            plVar8 = &(local_40.data.ref)->refCount;
            *plVar8 = *plVar8 + -1;
            if (*plVar8 == 0) {
              (*((RefCountedStorage *)&(local_40.data.ref)->_vptr_RefCountedStorage)->
                _vptr_RefCountedStorage[1])();
            }
            local_40.data.number = 0.0;
          }
          if ((local_b0 != (_func_int **)0x0) && (local_a8.tempNum._0_1_ == '\0')) {
            pp_Var9 = local_b0 + 1;
            *pp_Var9 = *pp_Var9 + -1;
            if (*pp_Var9 == (_func_int *)0x0) {
              (**(code **)(*local_b0 + 8))();
            }
          }
          if ((StringStorage *)local_108.ref == (StringStorage *)0x0) goto LAB_00146af4;
          aVar13 = local_108;
          local_d0.isTemp = (bool)(char)local_100;
          goto joined_r0x00146a88;
        }
        goto LAB_00146a9d;
      }
      p_Var2 = local_b0[3];
      lVar15 = local_108.ref[1].refCount - (long)p_Var2;
      if ((long)posB <= lVar15) {
        pp_Var14 = local_108.ref[1]._vptr_RefCountedStorage;
        __s2 = local_b0[2];
        local_f8 = context;
        do {
          iVar5 = strncmp((char *)((long)pp_Var14 + posB),(char *)__s2,(size_t)(p_Var2 + -1));
          context = local_f8;
          if (iVar5 == 0) goto LAB_001469c9;
          bVar17 = (long)posB < lVar15;
          posB = posB + 1;
        } while (bVar17);
        goto LAB_00146a9d;
      }
LAB_00146aa2:
      if (local_a8.tempNum._0_1_ == '\0') {
        pp_Var14 = pp_Var9 + 1;
        *pp_Var14 = *pp_Var14 + -1;
        if (*pp_Var14 == (_func_int *)0x0) {
          (**(code **)(*pp_Var9 + 8))(pp_Var9);
        }
      }
    }
    if (((StringStorage *)local_108.ref != (StringStorage *)0x0) && ((char)local_100 == '\0')) {
      plVar8 = &(local_108.ref)->refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 == 0) {
        pp_Var9 = ((RefCountedStorage *)&(local_108.ref)->_vptr_RefCountedStorage)->
                  _vptr_RefCountedStorage;
        local_d0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_108;
        goto LAB_00146ad1;
      }
    }
  }
  else if (local_e0[0] == Map) {
    Value::GetDict(&local_d0,(Value *)local_e0);
    pDVar6 = local_d0.ds;
    bVar17 = local_f0[0] == Null;
    if (local_d0.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      uVar11 = 0;
      do {
        pp_Var9 = (_func_int **)
                  (&((RefCountedStorage *)((long)local_d0.ds + 0x10))->refCount)[uVar11];
        if (pp_Var9 != (_func_int **)0x0) {
          local_f8 = context;
          goto LAB_001466db;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0xfb);
LAB_0014684b:
      local_d0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
      if (local_d0.isTemp != false) goto LAB_00146ad4;
LAB_00146865:
      plVar8 = &((local_d0.ds)->super_RefCountedStorage).refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 != 0) goto LAB_00146ad4;
      pp_Var9 = ((RefCountedStorage *)
                &((local_d0.ds)->super_RefCountedStorage)._vptr_RefCountedStorage)->
                _vptr_RefCountedStorage;
LAB_00146ad1:
      (*pp_Var9[1])(local_d0.ds);
    }
  }
  else if (local_e0[0] == List) {
    if ((StringStorage *)local_e0._8_8_ == (StringStorage *)0x0) {
      pp_Var9 = (_func_int **)0x0;
    }
    else {
      *(long *)(local_e0._8_8_ + 8) = *(long *)(local_e0._8_8_ + 8) + 1;
      pp_Var9 = ((RefCountedStorage *)(local_e0._8_8_ + 0x20))->_vptr_RefCountedStorage;
    }
    if (local_f0[0] == Null) {
      lVar15 = -1;
    }
    else {
      iVar4 = Value::IntValue((Value *)local_f0);
      pp_Var14 = (_func_int **)0x0;
      if (iVar4 < -1) {
        pp_Var14 = pp_Var9;
      }
      lVar15 = (long)pp_Var14 + (long)iVar4;
    }
    if ((lVar15 < -1) || ((long)pp_Var9 <= lVar15)) {
      IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
      pLVar3 = IntrinsicResult::Null;
      (context->code).ls = IntrinsicResult::Null;
      if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar8 = &(pLVar3->super_RefCountedStorage).refCount;
        *plVar8 = *plVar8 + 1;
      }
      if ((StringStorage *)aVar13.ref == (StringStorage *)0x0) goto LAB_00146af4;
    }
    else {
      lVar16 = lVar15 * 0x10 + 0x10;
      pp_Var14 = (_func_int **)(lVar15 + 1);
      local_f8 = context;
      do {
        pp_Var12 = pp_Var14;
        if (pp_Var9 == pp_Var12) {
          context = local_f8;
          local_d0.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)aVar13;
          if ((StringStorage *)aVar13.ref == (StringStorage *)0x0) goto LAB_00146ad4;
          goto LAB_00146865;
        }
        if ((StringStorage *)aVar13.ref == (StringStorage *)0x0) {
          _Error("Assert failed: ls",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                 ,0x3b);
        }
        if ((long)pp_Var12 < (long)aVar13.ref[2]._vptr_RefCountedStorage) {
          lhs = (Value *)(aVar13.ref[1].refCount + lVar16);
        }
        else {
          _Error("invalid index in SimpleVector::operator[]",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0xc1);
          lhs = (Value *)aVar13.ref[1].refCount;
        }
        dVar18 = Value::Equality(lhs,(Value *)local_80,0x10);
        context = local_f8;
        lVar16 = lVar16 + 0x10;
        pp_Var14 = (_func_int **)((long)pp_Var12 + 1);
      } while ((dVar18 != 1.0) || (NAN(dVar18)));
      local_50.data.number = (double)(long)pp_Var12;
      local_50.type = Number;
      local_50.noInvoke = false;
      local_50.localOnly = Off;
      ((RefCountedStorage *)&local_f8->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)local_f8);
      Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3)
                       ,&local_50);
      *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((2 < local_50.type) &&
         ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_50.data.ref !=
          (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
        plVar8 = &(local_50.data.ref)->refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((RefCountedStorage *)&(local_50.data.ref)->_vptr_RefCountedStorage)->
            _vptr_RefCountedStorage[1])();
        }
        local_50.data.number = 0.0;
      }
    }
    plVar8 = (long *)((long)aVar13.ref + 8);
    *plVar8 = *plVar8 + -1;
    if (*plVar8 != 0) goto LAB_00146af4;
    pp_Var9 = (aVar13.ref)->_vptr_RefCountedStorage;
    goto LAB_001466b2;
  }
LAB_00146ad4:
  IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
  pLVar3 = IntrinsicResult::Null;
  ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage =
       (_func_int **)IntrinsicResult::Null;
  if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar8 = &(pLVar3->super_RefCountedStorage).refCount;
    *plVar8 = *plVar8 + 1;
  }
LAB_00146af4:
  if ((Temp < local_f0[0]) && ((RefCountedStorage *)local_f0._8_8_ != (RefCountedStorage *)0x0)) {
    plVar8 = (long *)(local_f0._8_8_ + 8);
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*(*(_func_int ***)local_f0._8_8_)[1])();
    }
  }
  if ((Temp < local_80[0]) && ((RefCountedStorage *)local_80._8_8_ != (RefCountedStorage *)0x0)) {
    plVar8 = (long *)(local_80._8_8_ + 8);
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*(*(_func_int ***)local_80._8_8_)[1])();
    }
  }
  if ((Temp < local_e0[0]) && ((StringStorage *)local_e0._8_8_ != (StringStorage *)0x0)) {
    plVar8 = (long *)(local_e0._8_8_ + 8);
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*((RefCountedStorage *)local_e0._8_8_)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
LAB_001466db:
  if (bVar17) {
    local_108.tempNum._0_3_ = *(undefined3 *)(pp_Var9 + 3);
    local_100 = pp_Var9[4];
    if (local_100 != (_func_int *)0x0 && 2 < *(byte *)(pp_Var9 + 3)) {
      *(long *)(local_100 + 8) = *(long *)(local_100 + 8) + 1;
    }
    pDVar19 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
              Value::Equality((Value *)&local_108,(Value *)local_80,0x10);
    if ((2 < (byte)local_108.tempNum._0_1_) && (local_100 != (_func_int *)0x0)) {
      pcVar1 = local_100 + 8;
      *(long *)pcVar1 = *(long *)pcVar1 + -1;
      if (*(long *)pcVar1 == 0) {
        local_b8 = pDVar19;
        (**(code **)(*(long *)local_100 + 8))();
        pDVar19 = local_b8;
      }
    }
    context = local_f8;
    bVar17 = true;
    if (((double)pDVar19 == 1.0) && (!NAN((double)pDVar19))) goto LAB_0014687a;
  }
  else {
    local_108.tempNum._0_3_ = *(undefined3 *)(pp_Var9 + 1);
    local_100 = pp_Var9[2];
    if (local_100 != (_func_int *)0x0 && 2 < *(byte *)(pp_Var9 + 1)) {
      *(long *)(local_100 + 8) = *(long *)(local_100 + 8) + 1;
    }
    pDVar19 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
              Value::Equality((Value *)&local_108,(Value *)local_f0,0x10);
    if ((2 < (byte)local_108.tempNum._0_1_) && (local_100 != (_func_int *)0x0)) {
      pcVar1 = local_100 + 8;
      *(long *)pcVar1 = *(long *)pcVar1 + -1;
      if (*(long *)pcVar1 == 0) {
        local_b8 = pDVar19;
        (**(code **)(*(long *)local_100 + 8))();
        pDVar19 = local_b8;
      }
    }
    if (((double)pDVar19 != 1.0) || (NAN((double)pDVar19))) {
      bVar17 = false;
    }
    else {
      bVar17 = true;
    }
  }
  pp_Var9 = (_func_int **)*pp_Var9;
  if (pp_Var9 == (_func_int **)0x0) {
    iVar5 = (int)uVar11;
    uVar10 = 0xfa;
    if (0xfa < iVar5) {
      uVar10 = uVar11 & 0xffffffff;
    }
    if (0xf9 < iVar5) {
LAB_0014682c:
      local_d0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
      context = local_f8;
      if (local_d0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)
      goto LAB_00146ad4;
      goto LAB_0014684b;
    }
    uVar11 = (ulong)iVar5;
    while( true ) {
      pp_Var9 = (&((RefCountedStorage *)((long)pDVar6 + 0x20))->_vptr_RefCountedStorage)[uVar11];
      uVar11 = uVar11 + 1;
      if (pp_Var9 != (_func_int **)0x0) break;
      if (uVar10 == uVar11) goto LAB_0014682c;
    }
  }
  goto LAB_001466db;
LAB_0014687a:
  local_70.type = *(ValueType *)(pp_Var9 + 1);
  local_70.noInvoke = *(bool *)((long)pp_Var9 + 9);
  local_70.localOnly = *(LocalOnlyMode *)((long)pp_Var9 + 10);
  local_70.data = (anon_union_8_3_2f476f46_for_data)pp_Var9[2];
  if ((IntrinsicResultStorage *)local_70.data.ref != (IntrinsicResultStorage *)0x0 &&
      Temp < local_70.type) {
    (local_70.data.ref)->refCount = (local_70.data.ref)->refCount + 1;
  }
  ((RefCountedStorage *)&local_f8->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)local_f8);
  Value::operator=((Value *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 3),
                   &local_70);
  *(undefined1 *)(((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage + 2) = 1;
  if ((Temp < local_70.type) &&
     ((IntrinsicResultStorage *)local_70.data.ref != (IntrinsicResultStorage *)0x0)) {
    plVar8 = &(local_70.data.ref)->refCount;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*((RefCountedStorage *)&(local_70.data.ref)->_vptr_RefCountedStorage)->
        _vptr_RefCountedStorage[1])();
    }
    local_70.data.number = 0.0;
  }
  local_d0._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001bf240;
  aVar13 = (anon_union_8_3_2f476f46_for_data)local_d0.ds;
  if (local_d0.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)
  goto LAB_00146af4;
joined_r0x00146a88:
  if (local_d0.isTemp != false) goto LAB_00146af4;
  plVar8 = &(aVar13.ref)->refCount;
  *plVar8 = *plVar8 + -1;
  if (*plVar8 != 0) goto LAB_00146af4;
  pp_Var9 = ((RefCountedStorage *)&(aVar13.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage;
LAB_001466b2:
  (*pp_Var9[1])(aVar13.number);
  goto LAB_00146af4;
}

Assistant:

static IntrinsicResult intrinsic_indexOf(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value value = context->GetVar("value");
		Value after = context->GetVar("after");
		if (self.type == ValueType::List) {
			ValueList list = self.GetList();
			long count = list.Count();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += count;
			if (afterIdx < -1 || afterIdx > count-1) return IntrinsicResult::Null;
			for (long i=afterIdx+1; i<count; i++) {
				if (Value::Equality(list[i], value) == 1) return IntrinsicResult(i);
			}
		} else if (self.type == ValueType::String) {
			String str = self.GetString();
			String s = value.ToString();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += str.Length();
			long idx = str.IndexOf(s, afterIdx+1);
			if (idx >= 0) return IntrinsicResult(idx);
		} else if (self.type == ValueType::Map) {
			ValueDict dict = self.GetDict();
			bool sawAfter = after.IsNull();
			for (ValueDictIterator kv = dict.GetIterator(); !kv.Done(); kv.Next()) {
				if (!sawAfter) {
					if (Value::Equality(kv.Key(), after) == 1) sawAfter = true;
				} else {
					if (Value::Equality(kv.Value(), value) == 1) return IntrinsicResult(kv.Key());
    			}
			}
		}
		return IntrinsicResult::Null;
	}